

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Attribute_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Attribute_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pAVar3;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KString local_2e0;
  KString local_2c0;
  __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
  local_2a0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Attribute_PDU *local_18;
  Attribute_PDU *this_local;
  
  local_18 = this;
  this_local = (Attribute_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Attribute PDU-\n");
  poVar2 = std::operator<<(poVar2,"Originating Simulation Address:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_OrigSimAddr);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Extended PDU Type:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringPDUType_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8ExtPDUType,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Protocol Version:   ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolVersion_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui8ExtProtocolVersion,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Record Type: ");
  DATA_TYPE::ENUMS::GetEnumAsStringAttributeID_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui32MasterRecType,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Action Code:        ");
  DATA_TYPE::ENUMS::GetEnumAsStringActionCode_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui8ActionCode,Value_02);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Records:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumAttrRecSets);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"Record Sets:\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
            ::begin(&this->m_vAttributeRecordSets);
  local_2a0._M_current =
       (AttributeRecordSet *)
       std::
       vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
       ::end(&this->m_vAttributeRecordSets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2a0);
    if (!bVar1) break;
    pAVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pAVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2e0);
    UTILS::IndentString(&local_2c0,&local_2e0,1,'\t');
    std::operator<<(local_190,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Attribute_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Attribute PDU-\n"
       << "Originating Simulation Address:\n"
       << IndentString( m_OrigSimAddr.GetAsString(), 1 )
       << "Extended PDU Type:  " << GetEnumAsStringPDUType( m_ui8ExtPDUType )                 << "\n"
       << "Protocol Version:   " << GetEnumAsStringProtocolVersion( m_ui8ExtProtocolVersion ) << "\n"
       << "Master Record Type: " << GetEnumAsStringAttributeID( m_ui32MasterRecType )         << "\n"
       << "Action Code:        " << GetEnumAsStringActionCode( m_ui8ActionCode )              << "\n"
       << "Number Of Records:  " << m_ui16NumAttrRecSets                                      << "\n"
       << "Record Sets:\n";

    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}